

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeLanguageCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_123594e::cmCMakeLanguageCommandCALL
               (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
               string *callCommand,size_t startArg,optional<(anonymous_namespace)::Defer> *defer,
               cmExecutionStatus *status)

{
  pointer pcVar1;
  string *psVar2;
  cmExecutionStatus *status_00;
  bool bVar3;
  static_string_view *psVar4;
  cmListFileContext *pcVar5;
  ulong uVar6;
  string *psVar7;
  pointer pcVar8;
  long lVar9;
  size_t i;
  cmMakefile *this;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  string_view value;
  cmListFileFunction func;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> funcArgs;
  string cmd;
  cmListFileContext context;
  undefined1 local_229;
  string *local_228;
  string *local_220;
  cmListFileFunction local_218;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_208;
  string local_1f0;
  pointer local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  char *local_1b8;
  undefined8 local_1b0;
  cmListFileFunction local_1a8;
  cmExecutionStatus *local_198;
  cmMakefile *local_190;
  string local_188;
  string local_168;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_e8;
  bool local_c8;
  cmListFileContext local_c0;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_50;
  pointer local_38;
  
  local_220 = callCommand;
  cmsys::SystemTools::LowerCase(&local_108,callCommand);
  psVar4 = std::
           __find_if<cm::static_string_view_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                     ((anonymous_namespace)::InvalidCommands,
                      (anonymous_namespace)::InvalidDeferCommands,&local_108);
  if (psVar4 == (static_string_view *)(anonymous_namespace)::InvalidDeferCommands) {
    if (((defer->super__Optional_base<(anonymous_namespace)::Defer,_false,_false>)._M_payload.
         super__Optional_payload<(anonymous_namespace)::Defer,_true,_false,_false>.
         super__Optional_payload_base<(anonymous_namespace)::Defer>._M_engaged != true) ||
       (psVar4 = std::
                 __find_if<cm::static_string_view_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                           ((anonymous_namespace)::InvalidDeferCommands,
                            &cmsys::SystemToolsManagerInstance,&local_108),
       psVar4 == (static_string_view *)&cmsys::SystemToolsManagerInstance)) {
      local_190 = status->Makefile;
      cmMakefile::GetBacktrace(local_190);
      pcVar5 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                         ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_1f0);
      cmListFileContext::cmListFileContext(&local_c0,pcVar5);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0._M_string_length);
      }
      local_208.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_208.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_208.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_228 = (string *)defer;
      local_198 = status;
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::reserve
                (&local_208,
                 ((long)(args->
                        super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>)
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(args->
                        super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>)
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 -
                 startArg);
      pcVar8 = (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar6 = ((long)(args->
                     super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pcVar8 >> 4) *
              -0x5555555555555555;
      if (startArg <= uVar6 && uVar6 - startArg != 0) {
        lVar9 = startArg * 0x30;
        do {
          std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
          emplace_back<std::__cxx11::string_const&,cmListFileArgument::Delimiter_const&,long&>
                    ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)&local_208,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(pcVar8->Value)._M_dataplus._M_p + lVar9),
                     (Delimiter *)((long)&pcVar8->Delim + lVar9),&local_c0.Line);
          startArg = startArg + 1;
          pcVar8 = (args->
                   super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          lVar9 = lVar9 + 0x30;
        } while (startArg <
                 (ulong)(((long)(args->
                                super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pcVar8 >> 4) *
                        -0x5555555555555555));
      }
      pcVar1 = (local_220->_M_dataplus)._M_p;
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,pcVar1,pcVar1 + local_220->_M_string_length);
      local_50.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_208.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_50.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_208.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_50.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_208.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_208.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_208.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_208.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_188._M_dataplus._M_p = (pointer)local_c0.Line;
      local_38 = (pointer)local_c0.Line;
      local_1f0._M_dataplus._M_p = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<cmListFileFunction::Implementation,std::allocator<cmListFileFunction::Implementation>,std::__cxx11::string,long&,long&,std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f0._M_string_length,
                 (Implementation **)&local_1f0,
                 (allocator<cmListFileFunction::Implementation> *)&local_229,&local_128,
                 (long *)&local_188,(long *)&local_38,&local_50);
      this = local_190;
      status_00 = local_198;
      local_218.Impl.
      super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_1f0._M_dataplus._M_p;
      local_218.Impl.
      super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0._M_string_length
      ;
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if (local_228[0x48] == (string)0x1) {
        if (*(long *)(local_228 + 8) == 0) {
          cmMakefile::NewDeferId_abi_cxx11_(&local_1f0,this);
          std::__cxx11::string::operator=(local_228,(string *)&local_1f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
        }
        psVar2 = local_228;
        if (*(long *)(local_228 + 0x28) != 0) {
          value._M_str = *(char **)local_228;
          value._M_len = *(size_t *)(local_228 + 8);
          cmMakefile::AddDefinition(this,(string *)(local_228 + 0x20),value);
        }
        if (*(cmMakefile **)(psVar2 + 0x40) != (cmMakefile *)0x0) {
          this = *(cmMakefile **)(psVar2 + 0x40);
        }
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,*(long *)psVar2,*(long *)(psVar2 + 8) + *(long *)psVar2);
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_168,local_c0.FilePath._M_dataplus._M_p,
                   local_c0.FilePath._M_dataplus._M_p + local_c0.FilePath._M_string_length);
        local_1a8.Impl.
        super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = local_218.Impl.
                 super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        local_1a8.Impl.
        super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             local_218.Impl.
             super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        if (local_218.Impl.
            super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_218.Impl.
             super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_218.Impl.
                  super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_218.Impl.
             super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_218.Impl.
                  super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        bVar3 = cmMakefile::DeferCall(this,&local_148,&local_168,&local_1a8);
        if (local_1a8.Impl.
            super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1a8.Impl.
                     super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if (!bVar3) {
          psVar7 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
          local_1f0._M_dataplus._M_p = (pointer)0x30;
          local_1f0._M_string_length = 0x8c7001;
          local_1f0.field_2._M_allocated_capacity = 0;
          local_1d0 = (psVar7->_M_dataplus)._M_p;
          local_1f0.field_2._8_8_ = psVar7->_M_string_length;
          local_1c8 = 0;
          local_1c0 = 0xe;
          local_1b8 = "\nat this time.";
          local_1b0 = 0;
          views_01._M_len = 3;
          views_01._M_array = (iterator)&local_1f0;
          cmCatViews(&local_188,views_01);
          std::__cxx11::string::_M_assign((string *)&status_00->Error);
          cmSystemTools::s_FatalErrorOccurred = true;
          local_e8._16_8_ = local_188.field_2._M_allocated_capacity;
          local_e8._M_value._M_dataplus._M_p = (_Alloc_hider)local_188._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) goto LAB_003ac300;
        }
      }
      else {
        local_c8 = false;
        bVar3 = cmMakefile::ExecuteCommand
                          (this,&local_218,status_00,
                           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_e8);
        if ((local_c8 == true) &&
           (local_c8 = false,
           local_e8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_e8._M_value + 0x10))) {
LAB_003ac300:
          operator_delete((void *)local_e8._M_value._M_dataplus._M_p,local_e8._16_8_ + 1);
        }
      }
      if (local_218.Impl.
          super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_218.Impl.
                   super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_208);
      if ((local_c0.DeferId.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_engaged == true) &&
         (local_c0.DeferId.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false,
         local_c0.DeferId.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_dataplus._M_p !=
         ((pointer)
         ((long)&local_c0.DeferId.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         + 0x10U))._M_p)) {
        operator_delete((void *)local_c0.DeferId.
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload._M_value._M_dataplus._M_p,
                        local_c0.DeferId.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.FilePath._M_dataplus._M_p != &local_c0.FilePath.field_2) {
        operator_delete(local_c0.FilePath._M_dataplus._M_p,
                        local_c0.FilePath.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.Name._M_dataplus._M_p != &local_c0.Name.field_2) {
        operator_delete(local_c0.Name._M_dataplus._M_p,
                        local_c0.Name.field_2._M_allocated_capacity + 1);
      }
      goto LAB_003abe27;
    }
    local_c0.Name._M_dataplus._M_p = (pointer)0x1b;
    local_c0.Name._M_string_length = 0x8c6fe5;
    local_c0.Name.field_2._M_allocated_capacity = 0;
    local_c0.FilePath._M_dataplus._M_p = (local_220->_M_dataplus)._M_p;
    local_c0.Name.field_2._8_8_ = local_220->_M_string_length;
    local_c0.FilePath._M_string_length = 0;
    views_00._M_len = 2;
    views_00._M_array = (iterator)&local_c0;
    cmCatViews(&local_1f0,views_00);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    local_c0.Name._M_dataplus._M_p = (pointer)0x1b;
    local_c0.Name._M_string_length = 0x8c6fe5;
    local_c0.Name.field_2._M_allocated_capacity = 0;
    local_c0.FilePath._M_dataplus._M_p = (local_220->_M_dataplus)._M_p;
    local_c0.Name.field_2._8_8_ = local_220->_M_string_length;
    local_c0.FilePath._M_string_length = 0;
    views._M_len = 2;
    views._M_array = (iterator)&local_c0;
    cmCatViews(&local_1f0,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  cmSystemTools::s_FatalErrorOccurred = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  bVar3 = false;
LAB_003abe27:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmCMakeLanguageCommandCALL(std::vector<cmListFileArgument> const& args,
                                std::string const& callCommand,
                                size_t startArg, cm::optional<Defer> defer,
                                cmExecutionStatus& status)
{
  // ensure specified command is valid
  // start/end flow control commands are not allowed
  auto cmd = cmSystemTools::LowerCase(callCommand);
  if (std::find(InvalidCommands.cbegin(), InvalidCommands.cend(), cmd) !=
      InvalidCommands.cend()) {
    return FatalError(status,
                      cmStrCat("invalid command specified: "_s, callCommand));
  }
  if (defer &&
      std::find(InvalidDeferCommands.cbegin(), InvalidDeferCommands.cend(),
                cmd) != InvalidDeferCommands.cend()) {
    return FatalError(status,
                      cmStrCat("invalid command specified: "_s, callCommand));
  }

  cmMakefile& makefile = status.GetMakefile();
  cmListFileContext context = makefile.GetBacktrace().Top();

  std::vector<cmListFileArgument> funcArgs;
  funcArgs.reserve(args.size() - startArg);

  // The rest of the arguments are passed to the function call above
  for (size_t i = startArg; i < args.size(); ++i) {
    funcArgs.emplace_back(args[i].Value, args[i].Delim, context.Line);
  }
  cmListFileFunction func{ callCommand, context.Line, context.Line,
                           std::move(funcArgs) };

  if (defer) {
    if (defer->Id.empty()) {
      defer->Id = makefile.NewDeferId();
    }
    if (!defer->IdVar.empty()) {
      makefile.AddDefinition(defer->IdVar, defer->Id);
    }
    cmMakefile* deferMakefile =
      defer->Directory ? defer->Directory : &makefile;
    if (!deferMakefile->DeferCall(defer->Id, context.FilePath, func)) {
      return FatalError(
        status,
        cmStrCat("DEFER CALL may not be scheduled in directory:\n  "_s,
                 deferMakefile->GetCurrentBinaryDirectory(),
                 "\nat this time."_s));
    }
    return true;
  }
  return makefile.ExecuteCommand(func, status);
}